

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O3

void __thiscall
program_options::command_line_parser::finish_option
          (command_line_parser *this,option *opt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *other_tokens,
          vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          *style_parsers)

{
  style_t sVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pfVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  option_description *poVar11;
  ulong uVar12;
  invalid_syntax *piVar13;
  unknown_option *this_00;
  pointer __value;
  bool bVar14;
  string original_token_for_exceptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  next_token;
  string local_e8;
  undefined1 local_c8 [32];
  option *local_a8;
  command_line_parser *local_a0;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  sVar2 = (opt->string_key)._M_string_length;
  if (sVar2 != 0) {
    local_78[0] = &local_68;
    pcVar3 = (opt->string_key)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_78,pcVar3,pcVar3 + sVar2);
    if ((opt->original_tokens).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (opt->original_tokens).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::_M_assign((string *)local_78);
    }
    sVar1 = this->m_style;
    poVar11 = options_description::find_nothrow
                        (this->m_options_description,&opt->string_key,(bool)((byte)(sVar1 >> 9) & 1)
                         ,(bool)((byte)(sVar1 >> 10) & 1),(bool)((byte)(sVar1 >> 0xb) & 1));
    if (poVar11 == (option_description *)0x0) {
      if (this->m_allow_unregistered != true) {
        local_a8 = opt;
        local_a0 = this;
        this_00 = (unknown_option *)__cxa_allocate_exception(0xb8);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
        unknown_option::unknown_option(this_00,&local_e8);
        __cxa_throw(this_00,&unknown_option::typeinfo,
                    error_with_option_name::~error_with_option_name);
      }
      opt->unregistered = true;
    }
    else {
      local_a8 = opt;
      local_a0 = this;
      option_description::key(poVar11,&opt->string_key);
      std::__cxx11::string::_M_assign((string *)opt);
      option_description::semantic(poVar11);
      uVar8 = (**(code **)(*(long *)local_e8._M_dataplus._M_p + 0x18))();
      if ((pointer)local_e8._M_string_length != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
      }
      option_description::semantic(poVar11);
      iVar9 = (**(code **)(*(long *)local_e8._M_dataplus._M_p + 0x20))();
      if ((pointer)local_e8._M_string_length != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
      }
      pbVar4 = (opt->value).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (opt->value).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = (long)pbVar5 - (long)pbVar4 >> 5;
      __value = (other_tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (other_tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      iVar10 = (int)uVar12;
      if ((uint)((int)((ulong)((long)pbVar6 - (long)__value) >> 5) + iVar10) < uVar8) {
        piVar13 = (invalid_syntax *)__cxa_allocate_exception(0xc0);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
        invalid_syntax::invalid_syntax(piVar13,missing_parameter,&local_e8,(string *)local_c8,0);
        *(undefined ***)&(piVar13->super_error_with_option_name).super_error =
             &PTR__error_with_option_name_0011fa68;
        __cxa_throw(piVar13,&invalid_command_line_syntax::typeinfo,
                    error_with_option_name::~error_with_option_name);
      }
      if (iVar9 == 0 && pbVar4 != pbVar5) {
        piVar13 = (invalid_syntax *)__cxa_allocate_exception(0xc0);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
        invalid_syntax::invalid_syntax(piVar13,extra_parameter,&local_e8,(string *)local_c8,0);
        *(undefined ***)&(piVar13->super_error_with_option_name).super_error =
             &PTR__error_with_option_name_0011fa68;
        __cxa_throw(piVar13,&invalid_command_line_syntax::typeinfo,
                    error_with_option_name::~error_with_option_name);
      }
      if (__value != pbVar6) {
        iVar9 = 0;
        if (uVar12 <= uVar8) {
          iVar9 = uVar8 - iVar10;
        }
        local_68.field_2._M_allocated_capacity = (size_type)&local_a8->original_tokens;
        local_68.field_2._8_8_ = &local_a8->value;
        do {
          bVar14 = iVar9 == 0;
          iVar9 = iVar9 + -1;
          if (bVar14) break;
          local_98.
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.
          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,1,__value,(allocator_type *)&local_e8);
          if (local_98.
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_98.
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            uVar12 = 0;
            do {
              pfVar7 = (style_parsers->
                       super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(style_parsers->
                                super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar7 >> 5) <=
                  uVar12) goto LAB_00110ea6;
              if (pfVar7[uVar12].super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
                goto LAB_00110f3f;
              }
              (**(code **)(((_Any_data *)(pfVar7 + uVar12))->_M_pod_data + 0x18))
                        ((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                          *)local_c8,(_Any_data *)(pfVar7 + uVar12),&local_48);
              local_e8.field_2._M_allocated_capacity =
                   (size_type)
                   local_98.
                   super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_e8._M_string_length =
                   (size_type)
                   local_98.
                   super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_e8._M_dataplus._M_p =
                   (pointer)local_98.
                            super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              local_98.
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
              local_98.
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
              local_98.
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
              local_c8._0_8_ = (pointer)0x0;
              local_c8._8_8_ = (pointer)0x0;
              local_c8._16_8_ = (pointer)0x0;
              std::
              vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                         *)&local_e8);
              std::
              vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                         *)local_c8);
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (local_98.
                     super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start ==
                     local_98.
                     super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::__cxx11::string::_M_assign((string *)local_78);
          sVar1 = local_a0->m_style;
          poVar11 = options_description::find_nothrow
                              (local_a0->m_options_description,
                               (other_tokens->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                               (bool)((byte)(sVar1 >> 9) & 1),(bool)((byte)(sVar1 >> 10) & 1),
                               (bool)((byte)(sVar1 >> 0xb) & 1));
          if (poVar11 != (option_description *)0x0) {
LAB_00110f3f:
            piVar13 = (invalid_syntax *)__cxa_allocate_exception(0xc0);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
            invalid_syntax::invalid_syntax(piVar13,missing_parameter,&local_e8,(string *)local_c8,0)
            ;
            *(undefined ***)&(piVar13->super_error_with_option_name).super_error =
                 &PTR__error_with_option_name_0011fa68;
            __cxa_throw(piVar13,&invalid_command_line_syntax::typeinfo,
                        error_with_option_name::~error_with_option_name);
          }
LAB_00110ea6:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68.field_2._8_8_,
                      (other_tokens->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68.field_2._M_allocated_capacity,
                      (other_tokens->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(other_tokens,
                     (other_tokens->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::~vector(&local_98);
          __value = (other_tokens->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (__value !=
                 (other_tokens->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if (local_78[0] != &local_68) {
      operator_delete(local_78[0],(ulong)(local_68._M_dataplus._M_p + 1));
    }
  }
  return;
}

Assistant:

void command_line_parser::finish_option(option& opt,
    std::vector<std::string>& other_tokens,
    const std::vector<style_parser>& style_parsers)
{
    if (opt.string_key.empty())
        return;

    //
    // Be defensive:
    // will have no original token if option created by handle_additional_parser()
    std::string original_token_for_exceptions = opt.string_key;
    if (opt.original_tokens.size())
        original_token_for_exceptions = opt.original_tokens[0];

    try
    {
        // First check that the option is valid, and get its description.
        const option_description* xd = m_options_description->find_nothrow(
            opt.string_key,
            is_style_active(command_line_style::allow_guessing),
            is_style_active(command_line_style::long_case_insensitive),
            is_style_active(command_line_style::short_case_insensitive));

        if (!xd)
        {
            if (m_allow_unregistered) {
                opt.unregistered = true;
                return;
            } else {
                throw unknown_option();
            }
        }
        const option_description& d = *xd;

        // Canonize the name
        opt.string_key = d.key(opt.string_key);

        // We check that the min/max number of tokens for the option
        // agrees with the number of tokens we have. The 'adjacent_value'
        // (the value in --foo=1) counts as a separate token, and if present
        // must be consumed. The following tokens on the command line may be
        // left unconsumed.
        unsigned min_tokens = d.semantic()->min_tokens();
        unsigned max_tokens = d.semantic()->max_tokens();

        unsigned present_tokens = static_cast<unsigned>(opt.value.size() + other_tokens.size());

        if (present_tokens >= min_tokens)
        {
            if (!opt.value.empty() && max_tokens == 0)
            {
                throw invalid_command_line_syntax(invalid_command_line_syntax::extra_parameter);
            }

            // Grab min_tokens values from other_tokens, but only if those tokens
            // are not recognized as options themselves.
            if (opt.value.size() <= min_tokens)
            {
                min_tokens -= static_cast<unsigned>(opt.value.size());
            }
            else
            {
                min_tokens = 0;
            }

            // Everything's OK, move the values to the result.
            for(;!other_tokens.empty() && min_tokens--; )
            {
                // check if extra parameter looks like a known option
                // we use style parsers to check if it is syntactically an option,
                // additionally we check if an option_description exists
                std::vector<option> followed_option;
                std::vector<std::string> next_token(1, other_tokens[0]);
                for (unsigned i = 0; followed_option.empty() && i < style_parsers.size(); ++i)
                {
                    followed_option = style_parsers[i](next_token);
                }
                if (!followed_option.empty())
                {
                    original_token_for_exceptions = other_tokens[0];
                    const option_description* od = m_options_description->find_nothrow(other_tokens[0],
                            is_style_active(command_line_style::allow_guessing),
                            is_style_active(command_line_style::long_case_insensitive),
                            is_style_active(command_line_style::short_case_insensitive));
                    if (od) {
                        throw invalid_command_line_syntax(invalid_command_line_syntax::missing_parameter);
                    }
                }
                opt.value.push_back(other_tokens[0]);
                opt.original_tokens.push_back(other_tokens[0]);
                other_tokens.erase(other_tokens.begin());
            }
        }
        else
        {
            throw invalid_command_line_syntax(invalid_command_line_syntax::missing_parameter);

        }
    }
    // use only original token for unknown_option / ambiguous_option since by definition
    //    they are unrecognised / unparsable
    catch(error_with_option_name& e)
    {
        // add context and rethrow
        e.add_context(opt.string_key, original_token_for_exceptions, get_canonical_option_prefix());
        throw;
    }

}